

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O2

Value __thiscall duckdb_tdigest::TDigest::quantileProcessed(TDigest *this,Value q)

{
  pointer pCVar1;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  long lVar3;
  Value VVar4;
  Value w1;
  Value x2;
  Value w2;
  double dVar5;
  Value index;
  double local_18;
  
  VVar4 = NAN;
  if ((0.0 <= q) && (q <= 1.0)) {
    pCVar1 = (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->processed_).
                  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4;
    if (lVar3 != 0) {
      if (lVar3 == 1) {
        VVar4 = pCVar1->mean_;
      }
      else {
        local_18 = q * this->processedWeight_;
        if (local_18 <= pCVar1->weight_ * 0.5) {
          VVar4 = (pCVar1->mean_ - this->min_) * ((local_18 + local_18) / pCVar1->weight_) +
                  this->min_;
        }
        else {
          _Var2 = std::
                  __lower_bound<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_less_val>
                            ((this->cumulative_).super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_18);
          if (_Var2._M_current + 1 ==
              (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pCVar1 = (this->processed_).
                     super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar5 = pCVar1[lVar3 + -1].weight_ * 0.5;
            VVar4 = pCVar1[lVar3 + -1].mean_;
            w1 = (local_18 - this->processedWeight_) - dVar5;
            w2 = dVar5 - w1;
            x2 = this->max_;
          }
          else {
            lVar3 = (long)_Var2._M_current -
                    (long)(this->cumulative_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            w2 = local_18 - _Var2._M_current[-1];
            w1 = *_Var2._M_current - local_18;
            pCVar1 = (this->processed_).
                     super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            VVar4 = *(Value *)((long)pCVar1 + lVar3 * 2 + -0x10);
            x2 = *(Value *)((long)pCVar1 + lVar3 * 2);
          }
          VVar4 = weightedAverage(VVar4,w1,x2,w2);
        }
      }
    }
  }
  return VVar4;
}

Assistant:

Value quantileProcessed(Value q) const {
		if (q < 0 || q > 1) {
			return NAN;
		}

		if (processed_.size() == 0) {
			// no sorted means no data, no way to get a quantile
			return NAN;
		} else if (processed_.size() == 1) {
			// with one data point, all quantiles lead to Rome

			return mean(0);
		}

		// we know that there are at least two sorted now
		auto n = processed_.size();

		// if values were stored in a sorted array, index would be the offset we are Weighterested in
		const auto index = q * processedWeight_;

		// at the boundaries, we return min_ or max_
		if (index <= weight(0) / 2.0) {
			return min_ + 2.0 * index / weight(0) * (mean(0) - min_);
		}

		auto iter = std::lower_bound(cumulative_.cbegin(), cumulative_.cend(), index);

		if (iter + 1 != cumulative_.cend()) {
			auto i = size_t(std::distance(cumulative_.cbegin(), iter));
			auto z1 = index - *(iter - 1);
			auto z2 = *(iter)-index;
			// LOG(INFO) << "z2 " << z2 << " index " << index << " z1 " << z1;
			return weightedAverage(mean(i - 1), z2, mean(i), z1);
		}
		auto z1 = index - processedWeight_ - weight(n - 1) / 2.0;
		auto z2 = weight(n - 1) / 2 - z1;
		return weightedAverage(mean(n - 1), z1, max_, z2);
	}